

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O2

void __thiscall RationalNum::setDenominator(RationalNum *this,longlong denominator_)

{
  ostream *poVar1;
  
  if (denominator_ != 0) {
    this->denominator = denominator_;
    return;
  }
  this->denominator = 1;
  this->numerator = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Denominator is 0! Not good! THe whole is set to 0.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void RationalNum::setDenominator(long long int denominator_) {
    if (denominator_ == 0) {
        denominator = 1;
        numerator = 0;
        cout << "Denominator is 0! Not good! THe whole is set to 0." << endl;
    } else {
        denominator = denominator_;
    }
}